

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

RK_S32 __thiscall MppMemService::chk_poison(MppMemService *this,MppMemNode *node)

{
  int iVar1;
  int local_38;
  int local_34;
  RK_S32 end;
  RK_S32 start;
  RK_S32 i;
  RK_S32 size;
  RK_U8 *node_ptr;
  MppMemNode *node_local;
  MppMemService *this_local;
  
  if ((this->debug & 0x20) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = (int)node->size;
    end = 0;
    local_34 = -1;
    local_38 = -1;
    if (iVar1 < 0x400) {
      for (; end < iVar1; end = end + 1) {
        if (*(char *)((long)node->ptr + (long)end) != -0x23) {
          if (local_34 < 0) {
            local_34 = end;
          }
          local_38 = end + 1;
        }
      }
      if ((-1 < local_34) || (-1 < local_38)) {
        _mpp_log_l(2,"mpp_mem","found memory %p size %d caller %s overwrite from %d to %d\n",
                   "chk_poison",node->ptr,node->size & 0xffffffff,node->caller,local_34,local_38);
        dump(this,node->caller);
      }
      this_local._4_4_ = local_38 - local_34;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RK_S32 MppMemService::chk_poison(MppMemNode *node)
{
    if ((debug & MEM_POISON) == 0)
        return 0;

    // check oldest memory and free it
    RK_U8 *node_ptr = (RK_U8 *)node->ptr;
    RK_S32 size = node->size;
    RK_S32 i = 0;
    RK_S32 start = -1;
    RK_S32 end = -1;

    if (size >= 1024)
        return 0;

    for (; i < size; i++) {
        if (node_ptr[i] != MEM_CHECK_MARK) {
            if (start < 0) {
                start = i;
            }
            end = i + 1;
        }
    }

    if (start >= 0 || end >= 0) {
        mpp_err_f("found memory %p size %d caller %s overwrite from %d to %d\n",
                  node_ptr, size, node->caller, start, end);
        dump(node->caller);
    }

    return end - start;
}